

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::initFromNonbasic(HModel *this)

{
  pointer piVar1;
  pointer piVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = this->numTot;
  if (0 < iVar4) {
    piVar1 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = 0;
    iVar5 = 0;
    do {
      if (piVar2[lVar3] == 0) {
        piVar1[iVar5] = (int)lVar3;
        iVar5 = iVar5 + 1;
        iVar4 = this->numTot;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar4);
  }
  allocate_WorkAndBaseArrays(this);
  populate_WorkArrays(this);
  mlFg_Update(this,this->mlFg_action_NewBasis);
  return;
}

Assistant:

void HModel::initFromNonbasic() {
  // Initialise basicIndex from nonbasic* then allocate and populate
  // (where possible) work* arrays and allocate basis* arrays
  initBasicIndex();
  allocate_WorkAndBaseArrays();
  populate_WorkArrays();

  //Deduce the consequences of a new basis
  mlFg_Update(mlFg_action_NewBasis);
}